

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::scrollContentsBy(QGraphicsView *this,int dx,int dy)

{
  Representation *pRVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  ViewportUpdateMode VVar7;
  QGraphicsViewPrivate *this_00;
  bool bVar8;
  char cVar9;
  int iVar10;
  QWidget *rect;
  QWidget *pQVar11;
  undefined4 in_register_00000034;
  int dx_00;
  long in_FS_OFFSET;
  double dVar12;
  undefined1 auVar13 [16];
  QRegion exposedScaled;
  QRegion exposed;
  QRegion rubberBandRegion;
  QRegion local_98;
  QRegion local_90;
  QRegion local_88;
  undefined8 local_80;
  long local_38;
  
  pQVar11 = (QWidget *)CONCAT44(in_register_00000034,dx);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  uVar6 = *(uint *)&this_00->field_0x300;
  *(uint *)&this_00->field_0x300 = uVar6 | 0x20;
  if ((uVar6 >> 8 & 1) != 0) goto LAB_005c16c1;
  bVar8 = QWidget::isRightToLeft((QWidget *)this);
  dx_00 = -dx;
  if (!bVar8) {
    dx_00 = dx;
  }
  VVar7 = this_00->viewportUpdateMode;
  if (VVar7 == FullViewportUpdate) {
LAB_005c14c4:
    QGraphicsViewPrivate::updateAll(this_00);
  }
  else if (VVar7 != NoViewportUpdate) {
    if ((this_00->field_0x300 & 0x40) == 0) goto LAB_005c14c4;
    uVar2 = (this_00->rubberBandRect).x1;
    uVar4 = (this_00->rubberBandRect).y1;
    uVar3 = (this_00->rubberBandRect).x2;
    uVar5 = (this_00->rubberBandRect).y2;
    auVar13._0_4_ = -(uint)((int)uVar3 < (int)uVar2);
    auVar13._4_4_ = auVar13._0_4_;
    auVar13._8_4_ = -(uint)((int)uVar5 < (int)uVar4);
    auVar13._12_4_ = -(uint)((int)uVar5 < (int)uVar4);
    iVar10 = movmskpd(VVar7,auVar13);
    if (iVar10 == 0) {
      local_88.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      rect = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsViewPrivate::rubberBandRegion
                ((QGraphicsViewPrivate *)&stack0xffffffffffffff78,pQVar11,(QRect *)rect);
      QRegion::translated((int)&local_90,(int)(QGraphicsViewPrivate *)&stack0xffffffffffffff78);
      QRegion::operator+=(&stack0xffffffffffffff78,&local_90);
      QRegion::~QRegion(&local_90);
      pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QWidget::update(pQVar11,&stack0xffffffffffffff78);
      QRegion::~QRegion(&stack0xffffffffffffff78);
    }
    (this_00->dirtyScrollOffset).xp.m_i = (this_00->dirtyScrollOffset).xp.m_i + dx_00;
    pRVar1 = &(this_00->dirtyScrollOffset).yp;
    pRVar1->m_i = pRVar1->m_i + dy;
    QRegion::translate((int)this_00 + 0x528,dx_00);
    pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QWidget::scroll(pQVar11,dx_00,dy);
  }
  QGraphicsViewPrivate::updateLastCenterPoint(this_00);
  if (((this_00->cacheMode).super_QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>.
       super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i & 1) != 0) {
    dVar12 = (double)QPixmap::devicePixelRatio();
    local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_90);
    cVar9 = QPixmap::isNull();
    if (cVar9 == '\0') {
      _local_88 = QPixmap::rect();
      QPixmap::scroll((int)this_00 + 0x4f0,(int)((double)dx_00 * dVar12),
                      (QRect *)(ulong)(uint)(int)((double)dy * dVar12),&stack0xffffffffffffff78);
    }
    QRegion::translate((int)&this_00->backgroundPixmapExposed,dx_00);
    local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QTransform::fromScale(1.0 / dVar12,1.0 / dVar12);
    QTransform::map(&local_98);
    QRegion::operator+=(&this_00->backgroundPixmapExposed,&local_98);
    QRegion::~QRegion(&local_98);
    QRegion::~QRegion(&local_90);
  }
  if ((this_00->field_0x300 & 1) != 0) {
    QGraphicsViewPrivate::replayLastMouseEvent(this_00);
  }
LAB_005c16c1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::scrollContentsBy(int dx, int dy)
{
    Q_D(QGraphicsView);
    d->dirtyScroll = true;
    if (d->transforming)
        return;
    if (isRightToLeft())
        dx = -dx;

    if (d->viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (d->viewportUpdateMode != QGraphicsView::FullViewportUpdate) {
            if (d->accelerateScrolling) {
#if QT_CONFIG(rubberband)
                // Update new and old rubberband regions
                if (!d->rubberBandRect.isEmpty()) {
                    QRegion rubberBandRegion(d->rubberBandRegion(viewport(), d->rubberBandRect));
                    rubberBandRegion += rubberBandRegion.translated(-dx, -dy);
                    viewport()->update(rubberBandRegion);
                }
#endif
                d->dirtyScrollOffset.rx() += dx;
                d->dirtyScrollOffset.ry() += dy;
                d->dirtyRegion.translate(dx, dy);
                viewport()->scroll(dx, dy);
            } else {
                d->updateAll();
            }
        } else {
            d->updateAll();
        }
    }

    d->updateLastCenterPoint();

    if (d->cacheMode & CacheBackground) {
        // Below, QPixmap::scroll() works in device pixels, while the delta values
        // and backgroundPixmapExposed are in device independent pixels.
        const qreal dpr = d->backgroundPixmap.devicePixelRatio();
        const qreal inverseDpr = qreal(1) / dpr;

        // Scroll the background pixmap
        QRegion exposed;
        if (!d->backgroundPixmap.isNull())
            d->backgroundPixmap.scroll(dx * dpr, dy * dpr, d->backgroundPixmap.rect(), &exposed);

        // Invalidate the background pixmap
        d->backgroundPixmapExposed.translate(dx, dy);
        const QRegion exposedScaled = QTransform::fromScale(inverseDpr, inverseDpr).map(exposed);
        d->backgroundPixmapExposed += exposedScaled;
    }

    // Always replay on scroll.
    if (d->sceneInteractionAllowed)
        d->replayLastMouseEvent();
}